

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JHandler.h
# Opt level: O1

void __thiscall JHandler::JHandler(JHandler *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 local_11;
  
  (this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010bc60;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)(p_Var1 + 2);
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  *(undefined1 *)&p_Var1[2]._vptr__Sp_counted_base = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)(p_Var1 + 4);
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  *(undefined1 *)&p_Var1[4]._vptr__Sp_counted_base = 0;
  (this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  std::__shared_ptr<JHandler::metadata,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<JHandler::metadata>>
            ((__shared_ptr<JHandler::metadata,(__gnu_cxx::_Lock_policy)2> *)&this->MD_ptr,
             (allocator<JHandler::metadata> *)&local_11);
  (this->error_msg)._M_dataplus._M_p = (pointer)&(this->error_msg).field_2;
  (this->error_msg)._M_string_length = 0;
  (this->error_msg).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

JHandler() = default;